

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestPassingTestHasNoFailures::~TestPassingTestHasNoFailures
          (TestPassingTestHasNoFailures *this)

{
  TestPassingTestHasNoFailures *this_local;
  
  ~TestPassingTestHasNoFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(PassingTestHasNoFailures)
{
    class PassingTest : public Test
    {
    public:
        PassingTest() : Test("passing") {}
        virtual void RunImpl() const
        {
            CHECK(true);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		PassingTest().Run();
	}

    CHECK_EQUAL(0, results.GetFailureCount());
}